

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureLevelCase::~TextureLevelCase
          (TextureLevelCase *this)

{
  code *pcVar1;
  TextureLevelCase *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

TextureLevelCase::~TextureLevelCase (void)
{
	deinit();
}